

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaInitTypes(void)

{
  xmlSchemaTypePtr pxVar1;
  xmlChar *pxVar2;
  xmlSchemaParticlePtr pxVar3;
  xmlSchemaTreeItemPtr_conflict pxVar4;
  xmlSchemaWildcardPtr pxVar5;
  
  if (xmlSchemaTypesInitialized != '\0') {
    return 0;
  }
  xmlSchemaNAN = NAN;
  xmlSchemaPINF = INFINITY;
  xmlSchemaNINF = -INFINITY;
  xmlSchemaTypesBank = xmlHashCreate(0x28);
  if (xmlSchemaTypesBank != (xmlHashTablePtr)0x0) {
    pxVar1 = xmlSchemaInitBasicType("anyType",XML_SCHEMAS_ANYTYPE,(xmlSchemaTypePtr)0x0);
    xmlSchemaTypeAnyTypeDef = pxVar1;
    if (pxVar1 == (xmlSchemaTypePtr)0x0) goto LAB_001a92fd;
    pxVar1->baseType = pxVar1;
    pxVar1->contentType = XML_SCHEMA_CONTENT_MIXED;
    pxVar1 = (xmlSchemaTypePtr)xmlSchemaAddParticle();
    if (pxVar1 == (xmlSchemaTypePtr)0x0) goto LAB_001a92fd;
    xmlSchemaTypeAnyTypeDef->subtypes = pxVar1;
    pxVar2 = (xmlChar *)(*xmlMalloc)(0x28);
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar2[0] = '\0';
      pxVar2[1] = '\0';
      pxVar2[2] = '\0';
      pxVar2[3] = '\0';
      pxVar2[4] = '\0';
      pxVar2[5] = '\0';
      pxVar2[6] = '\0';
      pxVar2[7] = '\0';
      pxVar2[8] = '\0';
      pxVar2[9] = '\0';
      pxVar2[10] = '\0';
      pxVar2[0xb] = '\0';
      pxVar2[0xc] = '\0';
      pxVar2[0xd] = '\0';
      pxVar2[0xe] = '\0';
      pxVar2[0xf] = '\0';
      pxVar2[0x10] = '\0';
      pxVar2[0x11] = '\0';
      pxVar2[0x12] = '\0';
      pxVar2[0x13] = '\0';
      pxVar2[0x14] = '\0';
      pxVar2[0x15] = '\0';
      pxVar2[0x16] = '\0';
      pxVar2[0x17] = '\0';
      pxVar2[0x18] = '\0';
      pxVar2[0x19] = '\0';
      pxVar2[0x1a] = '\0';
      pxVar2[0x1b] = '\0';
      pxVar2[0x1c] = '\0';
      pxVar2[0x1d] = '\0';
      pxVar2[0x1e] = '\0';
      pxVar2[0x1f] = '\0';
      pxVar2[0x20] = '\0';
      pxVar2[0x21] = '\0';
      pxVar2[0x22] = '\0';
      pxVar2[0x23] = '\0';
      pxVar2[0x24] = '\0';
      pxVar2[0x25] = '\0';
      pxVar2[0x26] = '\0';
      pxVar2[0x27] = '\0';
      pxVar2[0] = '\x06';
      pxVar2[1] = '\0';
      pxVar2[2] = '\0';
      pxVar2[3] = '\0';
      pxVar1->id = pxVar2;
      pxVar3 = xmlSchemaAddParticle();
      if (pxVar3 == (xmlSchemaParticlePtr)0x0) goto LAB_001a92fd;
      pxVar3->minOccurs = 0;
      pxVar3->maxOccurs = 0x40000000;
      *(xmlSchemaParticlePtr *)(pxVar2 + 0x18) = pxVar3;
      pxVar4 = (xmlSchemaTreeItemPtr_conflict)(*xmlMalloc)(0x48);
      if (pxVar4 != (xmlSchemaTreeItemPtr_conflict)0x0) {
        *(undefined8 *)pxVar4 = 0;
        pxVar4->annot = (xmlSchemaAnnotPtr)0x0;
        *(undefined8 *)(pxVar4 + 1) = 0;
        pxVar4[1].annot = (xmlSchemaAnnotPtr)0x0;
        pxVar4[1].next = (xmlSchemaTreeItemPtr)0x0;
        pxVar4[1].children = (xmlSchemaTreeItemPtr)0x0;
        pxVar4->next = (xmlSchemaTreeItemPtr)0x0;
        pxVar4->children = (xmlSchemaTreeItemPtr)0x0;
        *(undefined8 *)(pxVar4 + 2) = 0;
        pxVar4->type = XML_SCHEMA_TYPE_ANY;
        pxVar4[1].annot = (xmlSchemaAnnotPtr)0x100000002;
        pxVar3->children = pxVar4;
        pxVar5 = (xmlSchemaWildcardPtr)(*xmlMalloc)(0x48);
        if (pxVar5 != (xmlSchemaWildcardPtr)0x0) {
          pxVar5->minOccurs = 0;
          pxVar5->maxOccurs = 0;
          pxVar5->processContents = 0;
          pxVar5->any = 0;
          pxVar5->nsSet = (xmlSchemaWildcardNsPtr)0x0;
          pxVar5->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
          pxVar5->annot = (xmlSchemaAnnotPtr)0x0;
          pxVar5->node = (xmlNodePtr)0x0;
          *(undefined8 *)pxVar5 = 0;
          pxVar5->id = (xmlChar *)0x0;
          *(undefined8 *)&pxVar5->flags = 0;
          pxVar5->processContents = 2;
          pxVar1 = xmlSchemaTypeAnyTypeDef;
          pxVar5->any = 1;
          xmlSchemaTypeAnyTypeDef->attributeWildcard = pxVar5;
          xmlSchemaTypeAnySimpleTypeDef =
               xmlSchemaInitBasicType("anySimpleType",XML_SCHEMAS_ANYSIMPLETYPE,pxVar1);
          if (((((xmlSchemaTypeAnySimpleTypeDef != (xmlSchemaTypePtr)0x0) &&
                (xmlSchemaTypeStringDef =
                      xmlSchemaInitBasicType
                                ("string",XML_SCHEMAS_STRING,xmlSchemaTypeAnySimpleTypeDef),
                xmlSchemaTypeStringDef != (xmlSchemaTypePtr)0x0)) &&
               (xmlSchemaTypeDecimalDef =
                     xmlSchemaInitBasicType
                               ("decimal",XML_SCHEMAS_DECIMAL,xmlSchemaTypeAnySimpleTypeDef),
               xmlSchemaTypeDecimalDef != (xmlSchemaTypePtr)0x0)) &&
              (((xmlSchemaTypeDateDef =
                      xmlSchemaInitBasicType("date",XML_SCHEMAS_DATE,xmlSchemaTypeAnySimpleTypeDef),
                xmlSchemaTypeDateDef != (xmlSchemaTypePtr)0x0 &&
                (xmlSchemaTypeDatetimeDef =
                      xmlSchemaInitBasicType
                                ("dateTime",XML_SCHEMAS_DATETIME,xmlSchemaTypeAnySimpleTypeDef),
                xmlSchemaTypeDatetimeDef != (xmlSchemaTypePtr)0x0)) &&
               ((xmlSchemaTypeTimeDef =
                      xmlSchemaInitBasicType("time",XML_SCHEMAS_TIME,xmlSchemaTypeAnySimpleTypeDef),
                xmlSchemaTypeTimeDef != (xmlSchemaTypePtr)0x0 &&
                ((xmlSchemaTypeGYearDef =
                       xmlSchemaInitBasicType
                                 ("gYear",XML_SCHEMAS_GYEAR,xmlSchemaTypeAnySimpleTypeDef),
                 xmlSchemaTypeGYearDef != (xmlSchemaTypePtr)0x0 &&
                 (xmlSchemaTypeGYearMonthDef =
                       xmlSchemaInitBasicType
                                 ("gYearMonth",XML_SCHEMAS_GYEARMONTH,xmlSchemaTypeAnySimpleTypeDef)
                 , xmlSchemaTypeGYearMonthDef != (xmlSchemaTypePtr)0x0)))))))) &&
             (((((xmlSchemaTypeGMonthDef =
                       xmlSchemaInitBasicType
                                 ("gMonth",XML_SCHEMAS_GMONTH,xmlSchemaTypeAnySimpleTypeDef),
                 xmlSchemaTypeGMonthDef != (xmlSchemaTypePtr)0x0 &&
                 ((((xmlSchemaTypeGMonthDayDef =
                          xmlSchemaInitBasicType
                                    ("gMonthDay",XML_SCHEMAS_GMONTHDAY,xmlSchemaTypeAnySimpleTypeDef
                                    ), xmlSchemaTypeGMonthDayDef != (xmlSchemaTypePtr)0x0 &&
                    (xmlSchemaTypeGDayDef =
                          xmlSchemaInitBasicType
                                    ("gDay",XML_SCHEMAS_GDAY,xmlSchemaTypeAnySimpleTypeDef),
                    xmlSchemaTypeGDayDef != (xmlSchemaTypePtr)0x0)) &&
                   (xmlSchemaTypeDurationDef =
                         xmlSchemaInitBasicType
                                   ("duration",XML_SCHEMAS_DURATION,xmlSchemaTypeAnySimpleTypeDef),
                   xmlSchemaTypeDurationDef != (xmlSchemaTypePtr)0x0)) &&
                  ((xmlSchemaTypeFloatDef =
                         xmlSchemaInitBasicType
                                   ("float",XML_SCHEMAS_FLOAT,xmlSchemaTypeAnySimpleTypeDef),
                   xmlSchemaTypeFloatDef != (xmlSchemaTypePtr)0x0 &&
                   (xmlSchemaTypeDoubleDef =
                         xmlSchemaInitBasicType
                                   ("double",XML_SCHEMAS_DOUBLE,xmlSchemaTypeAnySimpleTypeDef),
                   xmlSchemaTypeDoubleDef != (xmlSchemaTypePtr)0x0)))))) &&
                ((xmlSchemaTypeBooleanDef =
                       xmlSchemaInitBasicType
                                 ("boolean",XML_SCHEMAS_BOOLEAN,xmlSchemaTypeAnySimpleTypeDef),
                 xmlSchemaTypeBooleanDef != (xmlSchemaTypePtr)0x0 &&
                 ((xmlSchemaTypeAnyURIDef =
                        xmlSchemaInitBasicType
                                  ("anyURI",XML_SCHEMAS_ANYURI,xmlSchemaTypeAnySimpleTypeDef),
                  xmlSchemaTypeAnyURIDef != (xmlSchemaTypePtr)0x0 &&
                  (xmlSchemaTypeHexBinaryDef =
                        xmlSchemaInitBasicType
                                  ("hexBinary",XML_SCHEMAS_HEXBINARY,xmlSchemaTypeAnySimpleTypeDef),
                  xmlSchemaTypeHexBinaryDef != (xmlSchemaTypePtr)0x0)))))) &&
               (xmlSchemaTypeBase64BinaryDef =
                     xmlSchemaInitBasicType
                               ("base64Binary",XML_SCHEMAS_BASE64BINARY,
                                xmlSchemaTypeAnySimpleTypeDef),
               xmlSchemaTypeBase64BinaryDef != (xmlSchemaTypePtr)0x0)) &&
              (((((((xmlSchemaTypeNotationDef =
                          xmlSchemaInitBasicType
                                    ("NOTATION",XML_SCHEMAS_NOTATION,xmlSchemaTypeAnySimpleTypeDef),
                    xmlSchemaTypeNotationDef != (xmlSchemaTypePtr)0x0 &&
                    (xmlSchemaTypeQNameDef =
                          xmlSchemaInitBasicType
                                    ("QName",XML_SCHEMAS_QNAME,xmlSchemaTypeAnySimpleTypeDef),
                    xmlSchemaTypeQNameDef != (xmlSchemaTypePtr)0x0)) &&
                   (xmlSchemaTypeIntegerDef =
                         xmlSchemaInitBasicType
                                   ("integer",XML_SCHEMAS_INTEGER,xmlSchemaTypeDecimalDef),
                   xmlSchemaTypeIntegerDef != (xmlSchemaTypePtr)0x0)) &&
                  ((xmlSchemaTypeNonPositiveIntegerDef =
                         xmlSchemaInitBasicType
                                   ("nonPositiveInteger",XML_SCHEMAS_NPINTEGER,
                                    xmlSchemaTypeIntegerDef),
                   xmlSchemaTypeNonPositiveIntegerDef != (xmlSchemaTypePtr)0x0 &&
                   (xmlSchemaTypeNegativeIntegerDef =
                         xmlSchemaInitBasicType
                                   ("negativeInteger",XML_SCHEMAS_NINTEGER,
                                    xmlSchemaTypeNonPositiveIntegerDef),
                   xmlSchemaTypeNegativeIntegerDef != (xmlSchemaTypePtr)0x0)))) &&
                 (((xmlSchemaTypeLongDef =
                         xmlSchemaInitBasicType("long",XML_SCHEMAS_LONG,xmlSchemaTypeIntegerDef),
                   xmlSchemaTypeLongDef != (xmlSchemaTypePtr)0x0 &&
                   ((xmlSchemaTypeIntDef =
                          xmlSchemaInitBasicType("int",XML_SCHEMAS_INT,xmlSchemaTypeLongDef),
                    xmlSchemaTypeIntDef != (xmlSchemaTypePtr)0x0 &&
                    (xmlSchemaTypeShortDef =
                          xmlSchemaInitBasicType("short",XML_SCHEMAS_SHORT,xmlSchemaTypeIntDef),
                    xmlSchemaTypeShortDef != (xmlSchemaTypePtr)0x0)))) &&
                  (xmlSchemaTypeByteDef =
                        xmlSchemaInitBasicType("byte",XML_SCHEMAS_BYTE,xmlSchemaTypeShortDef),
                  xmlSchemaTypeByteDef != (xmlSchemaTypePtr)0x0)))) &&
                (((xmlSchemaTypeNonNegativeIntegerDef =
                        xmlSchemaInitBasicType
                                  ("nonNegativeInteger",XML_SCHEMAS_NNINTEGER,
                                   xmlSchemaTypeIntegerDef),
                  xmlSchemaTypeNonNegativeIntegerDef != (xmlSchemaTypePtr)0x0 &&
                  (xmlSchemaTypeUnsignedLongDef =
                        xmlSchemaInitBasicType
                                  ("unsignedLong",XML_SCHEMAS_ULONG,
                                   xmlSchemaTypeNonNegativeIntegerDef),
                  xmlSchemaTypeUnsignedLongDef != (xmlSchemaTypePtr)0x0)) &&
                 (xmlSchemaTypeUnsignedIntDef =
                       xmlSchemaInitBasicType
                                 ("unsignedInt",XML_SCHEMAS_UINT,xmlSchemaTypeUnsignedLongDef),
                 xmlSchemaTypeUnsignedIntDef != (xmlSchemaTypePtr)0x0)))) &&
               ((((xmlSchemaTypeUnsignedShortDef =
                        xmlSchemaInitBasicType
                                  ("unsignedShort",XML_SCHEMAS_USHORT,xmlSchemaTypeUnsignedIntDef),
                  xmlSchemaTypeUnsignedShortDef != (xmlSchemaTypePtr)0x0 &&
                  (xmlSchemaTypeUnsignedByteDef =
                        xmlSchemaInitBasicType
                                  ("unsignedByte",XML_SCHEMAS_UBYTE,xmlSchemaTypeUnsignedShortDef),
                  xmlSchemaTypeUnsignedByteDef != (xmlSchemaTypePtr)0x0)) &&
                 ((xmlSchemaTypePositiveIntegerDef =
                        xmlSchemaInitBasicType
                                  ("positiveInteger",XML_SCHEMAS_PINTEGER,
                                   xmlSchemaTypeNonNegativeIntegerDef),
                  xmlSchemaTypePositiveIntegerDef != (xmlSchemaTypePtr)0x0 &&
                  ((xmlSchemaTypeNormStringDef =
                         xmlSchemaInitBasicType
                                   ("normalizedString",XML_SCHEMAS_NORMSTRING,xmlSchemaTypeStringDef
                                   ), xmlSchemaTypeNormStringDef != (xmlSchemaTypePtr)0x0 &&
                   (xmlSchemaTypeTokenDef =
                         xmlSchemaInitBasicType
                                   ("token",XML_SCHEMAS_TOKEN,xmlSchemaTypeNormStringDef),
                   xmlSchemaTypeTokenDef != (xmlSchemaTypePtr)0x0)))))) &&
                ((xmlSchemaTypeLanguageDef =
                       xmlSchemaInitBasicType("language",XML_SCHEMAS_LANGUAGE,xmlSchemaTypeTokenDef)
                 , xmlSchemaTypeLanguageDef != (xmlSchemaTypePtr)0x0 &&
                 (((((xmlSchemaTypeNameDef =
                           xmlSchemaInitBasicType("Name",XML_SCHEMAS_NAME,xmlSchemaTypeTokenDef),
                     xmlSchemaTypeNameDef != (xmlSchemaTypePtr)0x0 &&
                     (xmlSchemaTypeNmtokenDef =
                           xmlSchemaInitBasicType
                                     ("NMTOKEN",XML_SCHEMAS_NMTOKEN,xmlSchemaTypeTokenDef),
                     xmlSchemaTypeNmtokenDef != (xmlSchemaTypePtr)0x0)) &&
                    (xmlSchemaTypeNCNameDef =
                          xmlSchemaInitBasicType("NCName",XML_SCHEMAS_NCNAME,xmlSchemaTypeNameDef),
                    xmlSchemaTypeNCNameDef != (xmlSchemaTypePtr)0x0)) &&
                   ((xmlSchemaTypeIdDef =
                          xmlSchemaInitBasicType("ID",XML_SCHEMAS_ID,xmlSchemaTypeNCNameDef),
                    xmlSchemaTypeIdDef != (xmlSchemaTypePtr)0x0 &&
                    (xmlSchemaTypeIdrefDef =
                          xmlSchemaInitBasicType("IDREF",XML_SCHEMAS_IDREF,xmlSchemaTypeNCNameDef),
                    xmlSchemaTypeIdrefDef != (xmlSchemaTypePtr)0x0)))) &&
                  ((xmlSchemaTypeEntityDef =
                         xmlSchemaInitBasicType("ENTITY",XML_SCHEMAS_ENTITY,xmlSchemaTypeNCNameDef),
                   xmlSchemaTypeEntityDef != (xmlSchemaTypePtr)0x0 &&
                   (xmlSchemaTypeEntitiesDef =
                         xmlSchemaInitBasicType
                                   ("ENTITIES",XML_SCHEMAS_ENTITIES,xmlSchemaTypeAnySimpleTypeDef),
                   xmlSchemaTypeEntitiesDef != (xmlSchemaTypePtr)0x0)))))))))))))) {
            xmlSchemaTypeEntitiesDef->subtypes = xmlSchemaTypeEntityDef;
            xmlSchemaTypeIdrefsDef =
                 xmlSchemaInitBasicType("IDREFS",XML_SCHEMAS_IDREFS,xmlSchemaTypeAnySimpleTypeDef);
            if (xmlSchemaTypeIdrefsDef != (xmlSchemaTypePtr)0x0) {
              xmlSchemaTypeIdrefsDef->subtypes = xmlSchemaTypeIdrefDef;
              xmlSchemaTypeNmtokensDef =
                   xmlSchemaInitBasicType
                             ("NMTOKENS",XML_SCHEMAS_NMTOKENS,xmlSchemaTypeAnySimpleTypeDef);
              if (xmlSchemaTypeNmtokensDef != (xmlSchemaTypePtr)0x0) {
                xmlSchemaTypeNmtokensDef->subtypes = xmlSchemaTypeNmtokenDef;
                xmlSchemaTypesInitialized = '\x01';
                return 0;
              }
            }
          }
          goto LAB_001a92fd;
        }
      }
    }
  }
  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xf,
                      (xmlError *)0x0);
LAB_001a92fd:
  xmlSchemaCleanupTypesInternal();
  return -1;
}

Assistant:

int
xmlSchemaInitTypes(void)
{
    if (xmlSchemaTypesInitialized != 0)
        return (0);

#if defined(NAN) && defined(INFINITY)
    xmlSchemaNAN = NAN;
    xmlSchemaPINF = INFINITY;
    xmlSchemaNINF = -INFINITY;
#else
    /* MSVC doesn't allow division by zero in constant expressions. */
    double zero = 0.0;
    xmlSchemaNAN = 0.0 / zero;
    xmlSchemaPINF = 1.0 / zero;
    xmlSchemaNINF = -xmlSchemaPINF;
#endif

    xmlSchemaTypesBank = xmlHashCreate(40);
    if (xmlSchemaTypesBank == NULL) {
	xmlSchemaTypeErrMemory();
        goto error;
    }

    /*
    * 3.4.7 Built-in Complex Type Definition
    */
    xmlSchemaTypeAnyTypeDef = xmlSchemaInitBasicType("anyType",
                                                     XML_SCHEMAS_ANYTYPE,
						     NULL);
    if (xmlSchemaTypeAnyTypeDef == NULL)
        goto error;
    xmlSchemaTypeAnyTypeDef->baseType = xmlSchemaTypeAnyTypeDef;
    xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
    /*
    * Init the content type.
    */
    xmlSchemaTypeAnyTypeDef->contentType = XML_SCHEMA_CONTENT_MIXED;
    {
	xmlSchemaParticlePtr particle;
	xmlSchemaModelGroupPtr sequence;
	xmlSchemaWildcardPtr wild;
	/* First particle. */
	particle = xmlSchemaAddParticle();
	if (particle == NULL)
	    goto error;
	xmlSchemaTypeAnyTypeDef->subtypes = (xmlSchemaTypePtr) particle;
	/* Sequence model group. */
	sequence = (xmlSchemaModelGroupPtr)
	    xmlMalloc(sizeof(xmlSchemaModelGroup));
	if (sequence == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(sequence, 0, sizeof(xmlSchemaModelGroup));
	sequence->type = XML_SCHEMA_TYPE_SEQUENCE;
	particle->children = (xmlSchemaTreeItemPtr) sequence;
	/* Second particle. */
	particle = xmlSchemaAddParticle();
	if (particle == NULL)
	    goto error;
	particle->minOccurs = 0;
	particle->maxOccurs = UNBOUNDED;
	sequence->children = (xmlSchemaTreeItemPtr) particle;
	/* The wildcard */
	wild = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
	if (wild == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(wild, 0, sizeof(xmlSchemaWildcard));
	wild->type = XML_SCHEMA_TYPE_ANY;
	wild->any = 1;
	wild->processContents = XML_SCHEMAS_ANY_LAX;
	particle->children = (xmlSchemaTreeItemPtr) wild;
	/*
	* Create the attribute wildcard.
	*/
	wild = (xmlSchemaWildcardPtr) xmlMalloc(sizeof(xmlSchemaWildcard));
	if (wild == NULL) {
	    xmlSchemaTypeErrMemory();
	    goto error;
	}
	memset(wild, 0, sizeof(xmlSchemaWildcard));
	wild->any = 1;
	wild->processContents = XML_SCHEMAS_ANY_LAX;
	xmlSchemaTypeAnyTypeDef->attributeWildcard = wild;
    }
    xmlSchemaTypeAnySimpleTypeDef = xmlSchemaInitBasicType("anySimpleType",
                                                           XML_SCHEMAS_ANYSIMPLETYPE,
							   xmlSchemaTypeAnyTypeDef);
    if (xmlSchemaTypeAnySimpleTypeDef == NULL)
        goto error;
    /*
    * primitive datatypes
    */
    xmlSchemaTypeStringDef = xmlSchemaInitBasicType("string",
                                                    XML_SCHEMAS_STRING,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeStringDef == NULL)
        goto error;
    xmlSchemaTypeDecimalDef = xmlSchemaInitBasicType("decimal",
                                                     XML_SCHEMAS_DECIMAL,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDecimalDef == NULL)
        goto error;
    xmlSchemaTypeDateDef = xmlSchemaInitBasicType("date",
                                                  XML_SCHEMAS_DATE,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDateDef == NULL)
        goto error;
    xmlSchemaTypeDatetimeDef = xmlSchemaInitBasicType("dateTime",
                                                      XML_SCHEMAS_DATETIME,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDatetimeDef == NULL)
        goto error;
    xmlSchemaTypeTimeDef = xmlSchemaInitBasicType("time",
                                                  XML_SCHEMAS_TIME,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeTimeDef == NULL)
        goto error;
    xmlSchemaTypeGYearDef = xmlSchemaInitBasicType("gYear",
                                                   XML_SCHEMAS_GYEAR,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGYearDef == NULL)
        goto error;
    xmlSchemaTypeGYearMonthDef = xmlSchemaInitBasicType("gYearMonth",
                                                        XML_SCHEMAS_GYEARMONTH,
							xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGYearMonthDef == NULL)
        goto error;
    xmlSchemaTypeGMonthDef = xmlSchemaInitBasicType("gMonth",
                                                    XML_SCHEMAS_GMONTH,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGMonthDef == NULL)
        goto error;
    xmlSchemaTypeGMonthDayDef = xmlSchemaInitBasicType("gMonthDay",
                                                       XML_SCHEMAS_GMONTHDAY,
						       xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGMonthDayDef == NULL)
        goto error;
    xmlSchemaTypeGDayDef = xmlSchemaInitBasicType("gDay",
                                                  XML_SCHEMAS_GDAY,
						  xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeGDayDef == NULL)
        goto error;
    xmlSchemaTypeDurationDef = xmlSchemaInitBasicType("duration",
                                                      XML_SCHEMAS_DURATION,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDurationDef == NULL)
        goto error;
    xmlSchemaTypeFloatDef = xmlSchemaInitBasicType("float",
                                                   XML_SCHEMAS_FLOAT,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeFloatDef == NULL)
        goto error;
    xmlSchemaTypeDoubleDef = xmlSchemaInitBasicType("double",
                                                    XML_SCHEMAS_DOUBLE,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeDoubleDef == NULL)
        goto error;
    xmlSchemaTypeBooleanDef = xmlSchemaInitBasicType("boolean",
                                                     XML_SCHEMAS_BOOLEAN,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeBooleanDef == NULL)
        goto error;
    xmlSchemaTypeAnyURIDef = xmlSchemaInitBasicType("anyURI",
                                                    XML_SCHEMAS_ANYURI,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeAnyURIDef == NULL)
        goto error;
    xmlSchemaTypeHexBinaryDef = xmlSchemaInitBasicType("hexBinary",
                                                     XML_SCHEMAS_HEXBINARY,
						     xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeHexBinaryDef == NULL)
        goto error;
    xmlSchemaTypeBase64BinaryDef
        = xmlSchemaInitBasicType("base64Binary", XML_SCHEMAS_BASE64BINARY,
	xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeBase64BinaryDef == NULL)
        goto error;
    xmlSchemaTypeNotationDef = xmlSchemaInitBasicType("NOTATION",
                                                    XML_SCHEMAS_NOTATION,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeNotationDef == NULL)
        goto error;
    xmlSchemaTypeQNameDef = xmlSchemaInitBasicType("QName",
                                                   XML_SCHEMAS_QNAME,
						   xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeQNameDef == NULL)
        goto error;

    /*
     * derived datatypes
     */
    xmlSchemaTypeIntegerDef = xmlSchemaInitBasicType("integer",
                                                     XML_SCHEMAS_INTEGER,
						     xmlSchemaTypeDecimalDef);
    if (xmlSchemaTypeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNonPositiveIntegerDef =
        xmlSchemaInitBasicType("nonPositiveInteger",
                               XML_SCHEMAS_NPINTEGER,
			       xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeNonPositiveIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNegativeIntegerDef =
        xmlSchemaInitBasicType("negativeInteger", XML_SCHEMAS_NINTEGER,
	xmlSchemaTypeNonPositiveIntegerDef);
    if (xmlSchemaTypeNegativeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeLongDef =
        xmlSchemaInitBasicType("long", XML_SCHEMAS_LONG,
	xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeLongDef == NULL)
        goto error;
    xmlSchemaTypeIntDef = xmlSchemaInitBasicType("int", XML_SCHEMAS_INT,
	xmlSchemaTypeLongDef);
    if (xmlSchemaTypeIntDef == NULL)
        goto error;
    xmlSchemaTypeShortDef = xmlSchemaInitBasicType("short",
                                                   XML_SCHEMAS_SHORT,
						   xmlSchemaTypeIntDef);
    if (xmlSchemaTypeShortDef == NULL)
        goto error;
    xmlSchemaTypeByteDef = xmlSchemaInitBasicType("byte",
                                                  XML_SCHEMAS_BYTE,
						  xmlSchemaTypeShortDef);
    if (xmlSchemaTypeByteDef == NULL)
        goto error;
    xmlSchemaTypeNonNegativeIntegerDef =
        xmlSchemaInitBasicType("nonNegativeInteger",
                               XML_SCHEMAS_NNINTEGER,
			       xmlSchemaTypeIntegerDef);
    if (xmlSchemaTypeNonNegativeIntegerDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedLongDef =
        xmlSchemaInitBasicType("unsignedLong", XML_SCHEMAS_ULONG,
	xmlSchemaTypeNonNegativeIntegerDef);
    if (xmlSchemaTypeUnsignedLongDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedIntDef =
        xmlSchemaInitBasicType("unsignedInt", XML_SCHEMAS_UINT,
	xmlSchemaTypeUnsignedLongDef);
    if (xmlSchemaTypeUnsignedIntDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedShortDef =
        xmlSchemaInitBasicType("unsignedShort", XML_SCHEMAS_USHORT,
	xmlSchemaTypeUnsignedIntDef);
    if (xmlSchemaTypeUnsignedShortDef == NULL)
        goto error;
    xmlSchemaTypeUnsignedByteDef =
        xmlSchemaInitBasicType("unsignedByte", XML_SCHEMAS_UBYTE,
	xmlSchemaTypeUnsignedShortDef);
    if (xmlSchemaTypeUnsignedByteDef == NULL)
        goto error;
    xmlSchemaTypePositiveIntegerDef =
        xmlSchemaInitBasicType("positiveInteger", XML_SCHEMAS_PINTEGER,
	xmlSchemaTypeNonNegativeIntegerDef);
    if (xmlSchemaTypePositiveIntegerDef == NULL)
        goto error;
    xmlSchemaTypeNormStringDef = xmlSchemaInitBasicType("normalizedString",
                                                        XML_SCHEMAS_NORMSTRING,
							xmlSchemaTypeStringDef);
    if (xmlSchemaTypeNormStringDef == NULL)
        goto error;
    xmlSchemaTypeTokenDef = xmlSchemaInitBasicType("token",
                                                   XML_SCHEMAS_TOKEN,
						   xmlSchemaTypeNormStringDef);
    if (xmlSchemaTypeTokenDef == NULL)
        goto error;
    xmlSchemaTypeLanguageDef = xmlSchemaInitBasicType("language",
                                                      XML_SCHEMAS_LANGUAGE,
						      xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeLanguageDef == NULL)
        goto error;
    xmlSchemaTypeNameDef = xmlSchemaInitBasicType("Name",
                                                  XML_SCHEMAS_NAME,
						  xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeNameDef == NULL)
        goto error;
    xmlSchemaTypeNmtokenDef = xmlSchemaInitBasicType("NMTOKEN",
                                                     XML_SCHEMAS_NMTOKEN,
						     xmlSchemaTypeTokenDef);
    if (xmlSchemaTypeNmtokenDef == NULL)
        goto error;
    xmlSchemaTypeNCNameDef = xmlSchemaInitBasicType("NCName",
                                                    XML_SCHEMAS_NCNAME,
						    xmlSchemaTypeNameDef);
    if (xmlSchemaTypeNCNameDef == NULL)
        goto error;
    xmlSchemaTypeIdDef = xmlSchemaInitBasicType("ID", XML_SCHEMAS_ID,
						    xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeIdDef == NULL)
        goto error;
    xmlSchemaTypeIdrefDef = xmlSchemaInitBasicType("IDREF",
                                                   XML_SCHEMAS_IDREF,
						   xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeIdrefDef == NULL)
        goto error;
    xmlSchemaTypeEntityDef = xmlSchemaInitBasicType("ENTITY",
                                                    XML_SCHEMAS_ENTITY,
						    xmlSchemaTypeNCNameDef);
    if (xmlSchemaTypeEntityDef == NULL)
        goto error;
    /*
    * Derived list types.
    */
    /* ENTITIES */
    xmlSchemaTypeEntitiesDef = xmlSchemaInitBasicType("ENTITIES",
                                                      XML_SCHEMAS_ENTITIES,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeEntitiesDef == NULL)
        goto error;
    xmlSchemaTypeEntitiesDef->subtypes = xmlSchemaTypeEntityDef;
    /* IDREFS */
    xmlSchemaTypeIdrefsDef = xmlSchemaInitBasicType("IDREFS",
                                                    XML_SCHEMAS_IDREFS,
						    xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeIdrefsDef == NULL)
        goto error;
    xmlSchemaTypeIdrefsDef->subtypes = xmlSchemaTypeIdrefDef;

    /* NMTOKENS */
    xmlSchemaTypeNmtokensDef = xmlSchemaInitBasicType("NMTOKENS",
                                                      XML_SCHEMAS_NMTOKENS,
						      xmlSchemaTypeAnySimpleTypeDef);
    if (xmlSchemaTypeNmtokensDef == NULL)
        goto error;
    xmlSchemaTypeNmtokensDef->subtypes = xmlSchemaTypeNmtokenDef;

    xmlSchemaTypesInitialized = 1;
    return (0);

error:
    xmlSchemaCleanupTypesInternal();
    return (-1);
}